

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsCSharpOnly(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmValue __v;
  const_iterator cVar3;
  bool bVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  TVar2 = cmTarget::GetType(this->Target);
  if (((TVar2 == SHARED_LIBRARY) ||
      (TVar2 = cmTarget::GetType(this->Target), TVar2 == STATIC_LIBRARY)) ||
     (TVar2 = cmTarget::GetType(this->Target), TVar2 == EXECUTABLE)) {
    GetAllConfigCompileLanguages_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48,this);
    paVar1 = &local_68.field_2;
    local_68.field_2._M_allocated_capacity._0_4_ = 0x4b4e494c;
    local_68.field_2._M_allocated_capacity._4_2_ = 0x5245;
    local_68.field_2._M_local_buf[6] = '_';
    local_68.field_2._M_local_buf[7] = 'L';
    local_68.field_2._8_7_ = 0x45474155474e41;
    local_68._M_string_length = 0xf;
    local_68.field_2._M_local_buf[0xf] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    __v = GetProperty(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT17(local_68.field_2._M_local_buf[7],
                               CONCAT16(local_68.field_2._M_local_buf[6],
                                        CONCAT24(local_68.field_2._M_allocated_capacity._4_2_,
                                                 local_68.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((__v.Value != (string *)0x0) && ((__v.Value)->_M_string_length != 0)) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_48,__v.Value);
    }
    if (local_48._M_impl.super__Rb_tree_header._M_node_count == 1) {
      local_68.field_2._M_allocated_capacity._0_4_ = 0x61685343;
      local_68.field_2._M_allocated_capacity._4_2_ = 0x7072;
      local_68._M_string_length = 6;
      local_68.field_2._M_local_buf[6] = '\0';
      local_68._M_dataplus._M_p = (pointer)paVar1;
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_48,&local_68);
      bVar4 = (_Rb_tree_header *)cVar3._M_node != &local_48._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT17(local_68.field_2._M_local_buf[7],
                                 CONCAT16(local_68.field_2._M_local_buf[6],
                                          CONCAT24(local_68.field_2._M_allocated_capacity._4_2_,
                                                   local_68.field_2._M_allocated_capacity._0_4_))) +
                        1);
      }
    }
    else {
      bVar4 = false;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_48);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmGeneratorTarget::IsCSharpOnly() const
{
  // Only certain target types may compile CSharp.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return false;
  }
  std::set<std::string> languages = this->GetAllConfigCompileLanguages();
  // Consider an explicit linker language property, but *not* the
  // computed linker language that may depend on linked targets.
  cmValue linkLang = this->GetProperty("LINKER_LANGUAGE");
  if (cmNonempty(linkLang)) {
    languages.insert(*linkLang);
  }
  return languages.size() == 1 && languages.count("CSharp") > 0;
}